

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O1

shared_ptr<chaiscript::detail::Type_Conversion_Base> __thiscall
chaiscript::Type_Conversions::get_conversion(Type_Conversions *this,Type_Info *to,Type_Info *from)

{
  _Base_ptr p_Var1;
  const_iterator cVar2;
  out_of_range *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  Type_Info *in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char *pcVar5;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  size_type *local_90;
  size_type local_88;
  size_type local_80;
  undefined8 uStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)to);
  cVar2 = find((Type_Conversions *)to,from,in_RCX);
  if (cVar2._M_node != (_Base_ptr)&to[2].m_flags) {
    (this->m_mutex)._M_impl._M_rwlock.__align = *(long *)(cVar2._M_node + 1);
    p_Var1 = cVar2._M_node[1]._M_parent;
    *(_Base_ptr *)((long)&(this->m_mutex)._M_impl._M_rwlock + 8) = p_Var1;
    if (p_Var1 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
      }
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)to);
    sVar6.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    sVar6.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (shared_ptr<chaiscript::detail::Type_Conversion_Base>)
           sVar6.
           super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"No such conversion exists from ","");
  if ((in_RCX->m_flags & 0x20) == 0) {
    pcVar5 = *(char **)(in_RCX->m_bare_type_info + 8) +
             (**(char **)(in_RCX->m_bare_type_info + 8) == '*');
  }
  else {
    pcVar5 = "";
  }
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50,pcVar5);
  local_70._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar4) {
    local_70.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_70._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_70," to ");
  local_b0._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == paVar4) {
    local_b0.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_b0._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  if ((from->m_flags & 0x20) == 0) {
    pcVar5 = *(char **)(from->m_bare_type_info + 8) +
             (**(char **)(from->m_bare_type_info + 8) == '*');
  }
  else {
    pcVar5 = "";
  }
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_b0,pcVar5);
  local_90 = (size_type *)(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90 == paVar4) {
    local_80 = paVar4->_M_allocated_capacity;
    uStack_78 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_90 = &local_80;
  }
  else {
    local_80 = paVar4->_M_allocated_capacity;
  }
  local_88 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  std::out_of_range::out_of_range(this_00,(string *)&local_90);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

std::shared_ptr<detail::Type_Conversion_Base> get_conversion(const Type_Info &to, const Type_Info &from) const {
      chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);

      const auto itr = find(to, from);

      if (itr != m_conversions.end()) {
        return *itr;
      } else {
        throw std::out_of_range(std::string("No such conversion exists from ") + from.bare_name() + " to " + to.bare_name());
      }
    }